

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::DTDScanner::scanId
          (DTDScanner *this,XMLBuffer *pubIdToFill,XMLBuffer *sysIdToFill,IDTypes whatKind)

{
  bool bVar1;
  XMLCh XVar2;
  Codes toEmit;
  XMLScanner *this_00;
  bool hasSpace;
  bool skippedSomething;
  bool skippedSomething_1;
  bool local_2b;
  bool local_2a;
  bool local_29;
  
  pubIdToFill->fIndex = 0;
  sysIdToFill->fIndex = 0;
  bVar1 = XMLReader::skippedString(this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgSysIDString);
  if (bVar1) {
    if (whatKind == IDType_Public) {
      this_00 = this->fScanner;
      toEmit = ExpectedPublicId;
    }
    else {
      ReaderMgr::skipPastSpaces(this->fReaderMgr,&local_29,false);
      if (local_29 != false) {
        bVar1 = scanSystemLiteral(this,sysIdToFill);
        return bVar1;
      }
      this_00 = this->fScanner;
      toEmit = ExpectedWhitespace;
    }
LAB_0030dd0c:
    XMLScanner::emitError(this_00,toEmit);
    return false;
  }
  bVar1 = XMLReader::skippedString(this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgPubIDString);
  if (!bVar1) {
    this_00 = this->fScanner;
    toEmit = ExpectedSystemOrPublicId;
    goto LAB_0030dd0c;
  }
  ReaderMgr::skipPastSpaces(this->fReaderMgr,&local_2a,false);
  if (local_2a == false) {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
    XVar2 = ReaderMgr::peekNextChar(this->fReaderMgr);
    if ((XVar2 != L'\'') && (XVar2 != L'\"')) {
      return false;
    }
  }
  bVar1 = scanPublicLiteral(this,pubIdToFill);
  if (!bVar1) {
    return false;
  }
  if (whatKind == IDType_Public) {
    return true;
  }
  ReaderMgr::skipPastSpaces(this->fReaderMgr,&local_2b,false);
  XVar2 = ReaderMgr::peekNextChar(this->fReaderMgr);
  if (local_2b == false) {
    if (whatKind == IDType_External) {
      XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
      if ((XVar2 != L'\"') && (XVar2 != L'\'')) {
        return false;
      }
      goto LAB_0030dd50;
    }
    if ((XVar2 != L'\'') && (XVar2 != L'\"')) {
      return true;
    }
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  if ((XVar2 != L'\'') && (XVar2 != L'\"')) {
    if (whatKind != IDType_External) {
      return true;
    }
    XMLScanner::emitError(this->fScanner,ExpectedQuotedString);
    return true;
  }
LAB_0030dd50:
  bVar1 = scanSystemLiteral(this,sysIdToFill);
  if (!bVar1) {
    return false;
  }
  return true;
}

Assistant:

bool DTDScanner::scanId(          XMLBuffer&  pubIdToFill
                            ,       XMLBuffer&  sysIdToFill
                            , const IDTypes     whatKind)
{
    // Clean out both return buffers
    pubIdToFill.reset();
    sysIdToFill.reset();

    //
    //  Check first for the system id first. If we find it, and system id
    //  is one of the legal values, then lets try to scan it.
    //
    // 'SYSTEM' S SystemLiteral
    if (fReaderMgr->skippedString(XMLUni::fgSysIDString))
    {
        // If they were looking for a public id, then we failed
        if (whatKind == IDType_Public)
        {
            fScanner->emitError(XMLErrs::ExpectedPublicId);
            return false;
        }

        // We must skip spaces
        bool skippedSomething;
        fReaderMgr->skipPastSpaces(skippedSomething);
        if (!skippedSomething)
        {
            fScanner->emitError(XMLErrs::ExpectedWhitespace);
            return false;
        }

        // Get the system literal value
        return scanSystemLiteral(sysIdToFill);
    }

    // Now scan for public id
    // 'PUBLIC' S PubidLiteral S SystemLiteral
    //  or
    // 'PUBLIC' S PubidLiteral

    // If we don't have any public id string => Error
    if (!fReaderMgr->skippedString(XMLUni::fgPubIDString)) {
        fScanner->emitError(XMLErrs::ExpectedSystemOrPublicId);
        return false;
    }

    //
    //  So following this we must have whitespace, a public literal, whitespace,
    //  and a system literal.
    //
    bool skippedSomething;
    fReaderMgr->skipPastSpaces(skippedSomething);
    if (!skippedSomething)
    {
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

        //
        //  Just in case, if they just forgot the whitespace but the next char
        //  is a single or double quote, then keep going.
        //
        const XMLCh chPeek = fReaderMgr->peekNextChar();
        if ((chPeek != chDoubleQuote) && (chPeek != chSingleQuote))
            return false;
    }

    if (!scanPublicLiteral(pubIdToFill))
        return false;

    // If they wanted a public id, then this is all
    if (whatKind == IDType_Public)
        return true;

    // check if there is any space follows
    bool hasSpace;
    fReaderMgr->skipPastSpaces(hasSpace);

    //
    //  In order to recover best here we need to see if
    //  the next thing is a quote or not
    //
    const XMLCh chPeek = fReaderMgr->peekNextChar();
    const bool bIsQuote =  ((chPeek == chDoubleQuote)
                         || (chPeek == chSingleQuote));

    if (!hasSpace)
    {
        if (whatKind == IDType_External)
        {
            //
            //  If its an external Id, then we need to see the system id.
            //  So, emit the error. But, if the next char is a quote, don't
            //  give up since its probably going to work. The user just
            //  missed the separating space. Otherwise, fail.
            //
            fScanner->emitError(XMLErrs::ExpectedWhitespace);
            if (!bIsQuote)
                return false;
        }
         else
        {
            //
            //  We can legally return here. But, if the next char is a quote,
            //  then that's probably not what was desired, since its probably
            //  just that space was forgotten and there really is a system
            //  id to follow.
            //
            //  So treat it like missing whitespace if so and keep going.
            //  Else, just return success.
            //
            if (bIsQuote)
                fScanner->emitError(XMLErrs::ExpectedWhitespace);
             else
                return true;
        }
    }

    if (bIsQuote) {
        // there is a quote coming, scan the system literal
        if (!scanSystemLiteral(sysIdToFill))
            return false;
    }
    else {
        // no quote, if expecting exteral id, this is an error
        if (whatKind == IDType_External)
            fScanner->emitError(XMLErrs::ExpectedQuotedString);
    }

    return true;
}